

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaptexture.cpp
# Opt level: O2

void __thiscall FAutomapTexture::MakeTexture(FAutomapTexture *this)

{
  FString in_RAX;
  BYTE *pBVar1;
  ulong uVar2;
  FResourceFile **ppFVar3;
  ulong uVar4;
  FMemLump FVar5;
  ulong uVar6;
  FMemLump data;
  FMemLump local_28;
  
  local_28.Block.Chars = (FString)(FString)in_RAX.Chars;
  FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffd8,0xa07390);
  FVar5.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
  if (*(int *)((long)local_28.Block.Chars + -0xc) != 0) {
    FVar5.Block.Chars = local_28.Block.Chars;
  }
  uVar4 = (ulong)(this->super_FTexture).Width;
  uVar6 = (ulong)(this->super_FTexture).Height;
  pBVar1 = (BYTE *)operator_new__(uVar6 * uVar4);
  this->Pixels = pBVar1;
  for (uVar2 = 0; uVar2 < uVar4; uVar2 = uVar2 + 1) {
    ppFVar3 = (FResourceFile **)FVar5.Block.Chars;
    for (uVar4 = 0; uVar4 < uVar6; uVar4 = uVar4 + 1) {
      this->Pixels[uVar4 + uVar6 * uVar2] = *(BYTE *)ppFVar3;
      uVar6 = (ulong)(this->super_FTexture).Height;
      ppFVar3 = ppFVar3 + 0x28;
    }
    uVar4 = (ulong)(this->super_FTexture).Width;
    FVar5.Block.Chars = (FString)((long)FVar5.Block.Chars + 1);
  }
  FMemLump::~FMemLump(&stack0xffffffffffffffd8);
  return;
}

Assistant:

void FAutomapTexture::MakeTexture ()
{
	int x, y;
	FMemLump data = Wads.ReadLump (SourceLump);
	const BYTE *indata = (const BYTE *)data.GetMem();

	Pixels = new BYTE[Width * Height];

	for (x = 0; x < Width; ++x)
	{
		for (y = 0; y < Height; ++y)
		{
			Pixels[x*Height+y] = indata[x+320*y];
		}
	}
}